

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_2::ValidateBinaryUsingContextAndValidationState
          (spv_context_t *context,uint32_t *words,size_t num_words,spv_diagnostic *pDiagnostic,
          ValidationState_t *vstate)

{
  _Manager_type p_Var1;
  spv_position_t position;
  spv_position_t position_00;
  spv_position_t position_01;
  spv_position_t position_02;
  Instruction *pIVar2;
  Instruction **ppIVar3;
  bool bVar4;
  uint16_t uVar5;
  spv_result_t sVar6;
  uint32_t uVar7;
  uint uVar8;
  ExecutionModel EVar9;
  int iVar10;
  spv_const_binary binary;
  DiagnosticStream *pDVar11;
  undefined4 extraout_var;
  Instruction *pIVar12;
  Function *pFVar13;
  BasicBlock *pBVar14;
  pointer pIVar15;
  pointer psVar16;
  long lVar17;
  Instruction *inst_00;
  spv_result_t sVar18;
  char *pcVar19;
  byte bVar20;
  Instruction *inst_1;
  pointer pIVar21;
  ulong uVar22;
  Instruction **ppIVar23;
  bool bVar24;
  Instruction *inst;
  spv_endianness_t endian;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
  visited_entry_points;
  EntryPointDescription desc;
  string check_name;
  string desc_name;
  spv_header_t header;
  Instruction *local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  spv_endianness_t local_39c;
  Instruction **local_398;
  Instruction **ppIStack_390;
  Instruction **local_388;
  undefined1 local_378 [32];
  _Any_data local_358;
  _Manager_type local_348;
  _Invoker_type p_Stack_340;
  EntryPointDescription local_330;
  Instruction *local_2f8;
  pointer local_2f0;
  string local_2e8;
  string local_2c8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  size_t local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  size_t local_278;
  undefined8 local_268;
  undefined8 uStack_260;
  size_t local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  size_t local_238;
  spv_header_t local_228;
  _Any_data local_208;
  _Manager_type local_1f8;
  _Invoker_type local_1f0;
  spv_result_t local_38;
  ValidationState_t *_;
  
  binary = (spv_const_binary)operator_new(0x10);
  binary->code = words;
  binary->wordCount = num_words;
  sVar6 = spvBinaryEndianness(binary,&local_39c);
  if (sVar6 == SPV_SUCCESS) {
    sVar6 = spvBinaryHeaderGet(binary,local_39c,&local_228);
    if (sVar6 != SPV_SUCCESS) {
      local_268 = 0;
      uStack_260 = 0;
      local_258 = 0;
      local_378._0_8_ = local_378 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"");
      position_00.column = uStack_260;
      position_00.line = local_268;
      position_00.index = local_258;
      DiagnosticStream::DiagnosticStream
                ((DiagnosticStream *)&local_208,position_00,&context->consumer,(string *)local_378,
                 SPV_ERROR_INVALID_BINARY);
      pcVar19 = "Invalid SPIR-V header.";
      lVar17 = 0x16;
      goto LAB_00626ae8;
    }
    uVar7 = spvVersionForTargetEnv(context->target_env);
    if (uVar7 < local_228.version) {
      local_288 = 0;
      uStack_280 = 0;
      local_278 = 0;
      local_378._0_8_ = local_378 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"");
      position_01.column = uStack_280;
      position_01.line = local_288;
      position_01.index = local_278;
      DiagnosticStream::DiagnosticStream
                ((DiagnosticStream *)&local_208,position_01,&context->consumer,(string *)local_378,
                 SPV_ERROR_WRONG_VERSION);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208._M_pod_data,"Invalid SPIR-V binary version ",0x1e);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208._M_pod_data,".",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208._M_pod_data," for target environment ",0x18);
      local_330.name._M_dataplus._M_p = spvTargetEnvDescription(context->target_env);
      pDVar11 = DiagnosticStream::operator<<((DiagnosticStream *)&local_208,(char **)&local_330);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar11,".",1);
      sVar6 = pDVar11->error_;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
    }
    else {
      if (local_228.bound <= (vstate->options_->universal_limits_).max_id_bound) {
        local_378._0_8_ = *(undefined8 *)context;
        local_378._8_4_ = *(undefined4 *)&context->opcode_table;
        local_378._12_4_ = *(undefined4 *)((long)&context->opcode_table + 4);
        local_378._16_8_ = context->operand_table;
        local_378._24_8_ = context->ext_inst_table;
        local_358._M_unused._M_object = (void *)0x0;
        local_358._8_8_ = 0;
        local_348 = (_Manager_type)0x0;
        p_Stack_340 = (_Invoker_type)0x0;
        p_Var1 = (context->consumer).super__Function_base._M_manager;
        if (p_Var1 == (_Manager_type)0x0) {
          local_1f0 = (_Invoker_type)0x0;
          local_1f8 = (_Manager_type)0x0;
        }
        else {
          (*p_Var1)(&local_358,(_Any_data *)&context->consumer,__clone_functor);
          local_1f8 = (context->consumer).super__Function_base._M_manager;
          local_1f0 = (context->consumer)._M_invoker;
        }
        local_208._0_4_ = local_358._0_4_;
        local_208._4_4_ = local_358._4_4_;
        local_208._8_4_ = local_358._8_4_;
        local_208._12_4_ = local_358._12_4_;
        local_358._M_unused._M_object = (void *)0x0;
        local_358._8_8_ = 0;
        local_348 = std::
                    _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate.cpp:197:31)>
                    ::_M_manager;
        p_Stack_340 = std::
                      _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate.cpp:197:31)>
                      ::_M_invoke;
        if (local_1f8 != (_Manager_type)0x0) {
          (*local_1f8)(&local_208,&local_208,__destroy_functor);
        }
        spvBinaryParse((spv_const_context)local_378,vstate,words,num_words,
                       (spv_parsed_header_fn_t)0x0,ProcessExtensions,(spv_diagnostic *)0x0);
        sVar6 = spvBinaryParse(context,vstate,words,num_words,(spv_parsed_header_fn_t)0x0,
                               ProcessInstruction,pDiagnostic);
        if (sVar6 == SPV_SUCCESS) {
          local_398 = (Instruction **)0x0;
          ppIStack_390 = (Instruction **)0x0;
          local_388 = (Instruction **)0x0;
          pIVar15 = (vstate->ordered_instructions_).
                    super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_2f0 = (vstate->ordered_instructions_).
                      super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          bVar20 = 0;
          if (pIVar15 != local_2f0) {
            sVar18 = SPV_SUCCESS;
            local_3b8 = 0;
            local_3b0 = 0;
            do {
              uVar5 = (pIVar15->inst_).opcode;
              local_3c0 = pIVar15;
              if (uVar5 == 0xf) {
                local_2f8 = pIVar15;
                uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
                EVar9 = Instruction::GetOperandAs<spv::ExecutionModel>(local_3c0,0);
                local_3a8 = CONCAT44(extraout_var,EVar9);
                Instruction::GetOperandAs<std::__cxx11::string>(&local_2c8,local_3c0,2);
                local_330.name._M_dataplus._M_p = (pointer)&local_330.name.field_2;
                local_330.name._M_string_length = 0;
                local_330.name.field_2._M_local_buf[0] = '\0';
                local_330.interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
                local_330.interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_330.interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
                std::__cxx11::string::_M_assign((string *)&local_330);
                psVar16 = (local_3c0->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0x30 < (ulong)((long)(local_3c0->operands_).
                                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar16)
                   ) {
                  uVar22 = 3;
                  lVar17 = 0x30;
                  pIVar12 = local_3c0;
                  do {
                    local_208._0_4_ =
                         (pIVar12->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [*(ushort *)((long)&psVar16->offset + lVar17)];
                    if (local_330.interfaces.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_330.interfaces.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_330.interfaces,
                                 (iterator)
                                 local_330.interfaces.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (uint *)local_208._M_pod_data);
                      pIVar12 = local_3c0;
                    }
                    else {
                      *local_330.interfaces.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_208._0_4_;
                      local_330.interfaces.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_330.interfaces.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    uVar22 = uVar22 + 1;
                    psVar16 = (pIVar12->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar17 = lVar17 + 0x10;
                  } while (uVar22 < (ulong)((long)(pIVar12->operands_).
                                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)psVar16 >> 4));
                }
                ValidationState_t::RegisterEntryPoint
                          (vstate,uVar8,(ExecutionModel)local_3a8,&local_330);
                ppIVar3 = ppIStack_390;
                for (ppIVar23 = local_398; ppIVar3 != ppIVar23; ppIVar23 = ppIVar23 + 1) {
                  pIVar12 = *ppIVar23;
                  EVar9 = Instruction::GetOperandAs<spv::ExecutionModel>(pIVar12,0);
                  Instruction::GetOperandAs<std::__cxx11::string>(&local_2e8,pIVar12,2);
                  bVar4 = true;
                  if (local_2c8._M_string_length == local_2e8._M_string_length) {
                    bVar4 = true;
                    bVar24 = true;
                    if (local_2c8._M_string_length != 0) {
                      iVar10 = bcmp(local_2c8._M_dataplus._M_p,local_2e8._M_dataplus._M_p,
                                    local_2c8._M_string_length);
                      bVar24 = iVar10 == 0;
                    }
                    if (((ExecutionModel)local_3a8 == EVar9) && (bVar24)) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_DATA,
                                 local_3c0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208._M_pod_data,
                                 "2 Entry points cannot share the same name and ExecutionMode.",0x3c
                                );
                      sVar18 = local_38;
                      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
                      bVar4 = false;
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                    operator_delete(local_2e8._M_dataplus._M_p,
                                    local_2e8.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar4) {
                    bVar4 = false;
                    goto LAB_0062715c;
                  }
                }
                if (ppIStack_390 == local_388) {
                  std::
                  vector<spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>>::
                  _M_realloc_insert<spvtools::val::Instruction*const&>
                            ((vector<spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>>
                              *)&local_398,(iterator)ppIStack_390,&local_3c0);
                }
                else {
                  *ppIStack_390 = local_3c0;
                  ppIStack_390 = ppIStack_390 + 1;
                }
                local_3b8 = CONCAT71((int7)((ulong)local_3b8 >> 8),
                                     (byte)local_3b8 | (uint)local_3a8 - 0x1493 < 2);
                local_3b0 = CONCAT71((int7)((ulong)local_3b0 >> 8),
                                     (byte)local_3b0 | ((uint)local_3a8 & 0xfffffffe) == 0x14f4);
                bVar4 = true;
LAB_0062715c:
                if (local_330.interfaces.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_330.interfaces.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_330.interfaces.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_330.interfaces.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330.name._M_dataplus._M_p != &local_330.name.field_2) {
                  operator_delete(local_330.name._M_dataplus._M_p,
                                  CONCAT71(local_330.name.field_2._M_allocated_capacity._1_7_,
                                           local_330.name.field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                }
                sVar6 = sVar18;
                if (!bVar4) goto LAB_006274e8;
                uVar5 = (local_3c0->inst_).opcode;
                pIVar15 = local_2f8;
              }
              if (uVar5 == 0x39) {
                bVar4 = ValidationState_t::in_function_body(vstate);
                if (!bVar4) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,pIVar15)
                  ;
                  pcVar19 = "A FunctionCall must happen within a function body.";
                  lVar17 = 0x32;
                  goto LAB_006273cb;
                }
                uVar8 = Instruction::GetOperandAs<unsigned_int>(local_3c0,2);
                ValidationState_t::AddFunctionCallTarget(vstate,uVar8);
              }
              bVar4 = ValidationState_t::in_function_body(vstate);
              pIVar12 = local_3c0;
              if (bVar4) {
                pFVar13 = ValidationState_t::current_function(vstate);
                pIVar2 = local_3c0;
                pIVar12->function_ = pFVar13;
                pFVar13 = ValidationState_t::current_function(vstate);
                pBVar14 = val::Function::current_block(pFVar13);
                pIVar2->block_ = pBVar14;
                bVar4 = ValidationState_t::in_block(vstate);
                if ((bVar4) &&
                   (bVar4 = spvOpcodeIsBlockTerminator((uint)(local_3c0->inst_).opcode), bVar4)) {
                  pFVar13 = ValidationState_t::current_function(vstate);
                  pBVar14 = val::Function::current_block(pFVar13);
                  pBVar14->terminator_ = local_3c0;
                }
              }
              sVar6 = IdPass(vstate,local_3c0);
              if ((((sVar6 != SPV_SUCCESS) ||
                   (sVar6 = CapabilityPass(vstate,pIVar15), sVar6 != SPV_SUCCESS)) ||
                  (sVar6 = ModuleLayoutPass(vstate,pIVar15), sVar6 != SPV_SUCCESS)) ||
                 ((sVar6 = CfgPass(vstate,pIVar15), sVar6 != SPV_SUCCESS ||
                  (sVar6 = InstructionPass(vstate,pIVar15), sVar6 != SPV_SUCCESS))))
              goto LAB_006274e8;
              ValidationState_t::RegisterInstruction(vstate,pIVar15);
              if ((pIVar15->inst_).opcode == 0x27) {
                uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar15,0);
                ValidationState_t::RegisterForwardPointer(vstate,uVar8);
              }
              pIVar15 = pIVar15 + 1;
            } while (pIVar15 != local_2f0);
            bVar20 = (byte)local_3b0 & (byte)local_3b8;
          }
          if ((vstate->addressing_model_ == AddressingModelMax) || (vstate->memory_model_ == Max)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,
                       (Instruction *)0x0);
            pcVar19 = "Missing required OpMemoryModel instruction.";
            lVar17 = 0x2b;
LAB_006273cb:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208._M_pod_data,pcVar19,lVar17);
LAB_006273dd:
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
            sVar6 = local_38;
          }
          else {
            bVar4 = ValidationState_t::in_function_body(vstate);
            if (bVar4) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,
                         (Instruction *)0x0);
              pcVar19 = "Missing OpFunctionEnd at end of module.";
              lVar17 = 0x27;
              goto LAB_006273cb;
            }
            bVar4 = EnumSet<spv::Capability>::contains
                              (&vstate->module_capabilities_,BindlessTextureNV);
            if ((bVar4) && (vstate->sampler_image_addressing_mode_ == 0)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,
                         (Instruction *)0x0);
              pcVar19 = "Missing required OpSamplerImageAddressingModeNV instruction.";
              lVar17 = 0x3c;
              goto LAB_006273cb;
            }
            if ((bVar20 & 1) != 0) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,
                         (Instruction *)0x0);
              ValidationState_t::VkErrorID_abi_cxx11_(&local_330.name,vstate,0x1bbe,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208._M_pod_data,local_330.name._M_dataplus._M_p,
                         local_330.name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208._M_pod_data,
                         "Module can\'t mix MeshEXT/TaskEXT with MeshNV/TaskNV Execution Model.",
                         0x44);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330.name._M_dataplus._M_p != &local_330.name.field_2) {
                operator_delete(local_330.name._M_dataplus._M_p,
                                CONCAT71(local_330.name.field_2._M_allocated_capacity._1_7_,
                                         local_330.name.field_2._M_local_buf[0]) + 1);
              }
              goto LAB_006273dd;
            }
            sVar6 = ValidateForwardDecls(vstate);
            if (sVar6 == SPV_SUCCESS) {
              ReachabilityPass(vstate);
              pIVar21 = (vstate->ordered_instructions_).
                        super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pIVar15 = (vstate->ordered_instructions_).
                        super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (pIVar15 != pIVar21) {
                lVar17 = 0;
                uVar22 = 0;
                do {
                  sVar6 = UpdateIdUse(vstate,(Instruction *)
                                             ((long)&(pIVar21->words_).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar17
                                             ));
                  if (sVar6 != SPV_SUCCESS) goto LAB_006274e8;
                  uVar22 = uVar22 + 1;
                  pIVar21 = (vstate->ordered_instructions_).
                            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pIVar15 = (vstate->ordered_instructions_).
                            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  lVar17 = lVar17 + 0x88;
                } while (uVar22 < (ulong)(((long)pIVar15 - (long)pIVar21 >> 3) * -0xf0f0f0f0f0f0f0f)
                        );
              }
              if (pIVar15 != pIVar21) {
                lVar17 = 0;
                uVar22 = 0;
                do {
                  _ = (ValidationState_t *)
                      ((long)&(pIVar21->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar17);
                  sVar6 = MiscPass(vstate,(Instruction *)_);
                  if ((((((((sVar6 != SPV_SUCCESS) ||
                           (sVar6 = DebugPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)) ||
                          (sVar6 = AnnotationPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS))
                         || (((sVar6 = ExtensionPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS
                              || (sVar6 = ModeSettingPass(vstate,(Instruction *)_),
                                 sVar6 != SPV_SUCCESS)) ||
                             ((sVar6 = TypePass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS ||
                              ((sVar6 = ConstantPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS
                               || (sVar6 = MemoryPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS
                                  )))))))) ||
                        (sVar6 = FunctionPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)) ||
                       (((sVar6 = ImagePass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS ||
                         (sVar6 = ConversionPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)) ||
                        (sVar6 = CompositesPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS))))
                      || (((sVar6 = ArithmeticsPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS
                           || (sVar6 = BitwisePass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS))
                          || (((sVar6 = LogicalsPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS
                               || ((sVar6 = ControlFlowPass(vstate,(Instruction *)_),
                                   sVar6 != SPV_SUCCESS ||
                                   (sVar6 = DerivativesPass(vstate,(Instruction *)_),
                                   sVar6 != SPV_SUCCESS)))) ||
                              (sVar6 = AtomicsPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)))
                          ))) ||
                     ((((((sVar6 = PrimitivesPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS ||
                          (sVar6 = BarriersPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)) ||
                         (sVar6 = NonUniformPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)) ||
                        ((sVar6 = LiteralsPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS ||
                         (sVar6 = RayQueryPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)))) ||
                       (sVar6 = RayTracingPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)) ||
                      (((sVar6 = RayReorderNVPass((val *)vstate,_,inst_00), sVar6 != SPV_SUCCESS ||
                        (sVar6 = MeshShadingPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)) ||
                       (sVar6 = TensorLayoutPass(vstate,(Instruction *)_), sVar6 != SPV_SUCCESS)))))
                     ) goto LAB_006274e8;
                  uVar22 = uVar22 + 1;
                  pIVar21 = (vstate->ordered_instructions_).
                            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar17 = lVar17 + 0x88;
                } while (uVar22 < (ulong)(((long)(vstate->ordered_instructions_).
                                                 super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pIVar21 >> 3) * -0xf0f0f0f0f0f0f0f));
              }
              sVar6 = ValidateAdjacency(vstate);
              if (((((sVar6 == SPV_SUCCESS) &&
                    (sVar6 = ValidateEntryPoints(vstate), sVar6 == SPV_SUCCESS)) &&
                   (sVar6 = PerformCfgChecks(vstate), sVar6 == SPV_SUCCESS)) &&
                  ((sVar6 = CheckIdDefinitionDominateUse(vstate), sVar6 == SPV_SUCCESS &&
                   (sVar6 = ValidateDecorations(vstate), sVar6 == SPV_SUCCESS)))) &&
                 ((sVar6 = ValidateInterfaces(vstate), sVar6 == SPV_SUCCESS &&
                  (sVar6 = ValidateBuiltIns(vstate), sVar6 == SPV_SUCCESS)))) {
                pIVar15 = (vstate->ordered_instructions_).
                          super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pIVar21 = (vstate->ordered_instructions_).
                          super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                while (((sVar6 = SPV_SUCCESS, pIVar15 != pIVar21 &&
                        (sVar6 = ValidateExecutionLimitations(vstate,pIVar15), sVar6 == SPV_SUCCESS)
                        ) && ((sVar6 = ValidateSmallTypeUses(vstate,pIVar15), sVar6 == SPV_SUCCESS
                              && (sVar6 = ValidateQCOMImageProcessingTextureUsages(vstate,pIVar15),
                                 sVar6 == SPV_SUCCESS))))) {
                  pIVar15 = pIVar15 + 1;
                }
              }
            }
          }
LAB_006274e8:
          if (local_398 != (Instruction **)0x0) {
            operator_delete(local_398,(long)local_388 - (long)local_398);
          }
        }
        if (local_348 != (_Manager_type)0x0) {
          (*local_348)(&local_358,&local_358,__destroy_functor);
        }
        goto LAB_00626b18;
      }
      local_2a8 = 0;
      uStack_2a0 = 0;
      local_298 = 0;
      local_378._0_8_ = local_378 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"");
      position_02.column = uStack_2a0;
      position_02.line = local_2a8;
      position_02.index = local_298;
      DiagnosticStream::DiagnosticStream
                ((DiagnosticStream *)&local_208,position_02,&context->consumer,(string *)local_378,
                 SPV_ERROR_INVALID_BINARY);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208._M_pod_data,
                 "Invalid SPIR-V.  The id bound is larger than the max id bound ",0x3e);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208._M_pod_data,".",1);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
      sVar6 = local_38;
    }
    if ((undefined1 *)local_378._0_8_ == local_378 + 0x10) goto LAB_00626b18;
  }
  else {
    local_248 = 0;
    uStack_240 = 0;
    local_238 = 0;
    local_378._0_8_ = local_378 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"");
    position.column = uStack_240;
    position.line = local_248;
    position.index = local_238;
    DiagnosticStream::DiagnosticStream
              ((DiagnosticStream *)&local_208,position,&context->consumer,(string *)local_378,
               SPV_ERROR_INVALID_BINARY);
    pcVar19 = "Invalid SPIR-V magic number.";
    lVar17 = 0x1c;
LAB_00626ae8:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208._M_pod_data,pcVar19,lVar17);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
    sVar6 = local_38;
    if ((undefined1 *)local_378._0_8_ == local_378 + 0x10) goto LAB_00626b18;
  }
  operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
LAB_00626b18:
  operator_delete(binary,0x10);
  return sVar6;
}

Assistant:

spv_result_t ValidateBinaryUsingContextAndValidationState(
    const spv_context_t& context, const uint32_t* words, const size_t num_words,
    spv_diagnostic* pDiagnostic, ValidationState_t* vstate) {
  auto binary = std::unique_ptr<spv_const_binary_t>(
      new spv_const_binary_t{words, num_words});

  spv_endianness_t endian;
  spv_position_t position = {};
  if (spvBinaryEndianness(binary.get(), &endian)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V magic number.";
  }

  spv_header_t header;
  if (spvBinaryHeaderGet(binary.get(), endian, &header)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V header.";
  }

  if (header.version > spvVersionForTargetEnv(context.target_env)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_WRONG_VERSION)
           << "Invalid SPIR-V binary version "
           << SPV_SPIRV_VERSION_MAJOR_PART(header.version) << "."
           << SPV_SPIRV_VERSION_MINOR_PART(header.version)
           << " for target environment "
           << spvTargetEnvDescription(context.target_env) << ".";
  }

  if (header.bound > vstate->options()->universal_limits_.max_id_bound) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V.  The id bound is larger than the max id bound "
           << vstate->options()->universal_limits_.max_id_bound << ".";
  }

  // Look for OpExtension instructions and register extensions.
  // This parse should not produce any error messages. Hijack the context and
  // replace the message consumer so that we do not pollute any state in input
  // consumer.
  spv_context_t hijacked_context = context;
  hijacked_context.consumer = [](spv_message_level_t, const char*,
                                 const spv_position_t&, const char*) {};
  spvBinaryParse(&hijacked_context, vstate, words, num_words,
                 /* parsed_header = */ nullptr, ProcessExtensions,
                 /* diagnostic = */ nullptr);

  // Parse the module and perform inline validation checks. These checks do
  // not require the knowledge of the whole module.
  if (auto error = spvBinaryParse(&context, vstate, words, num_words,
                                  /*parsed_header =*/nullptr,
                                  ProcessInstruction, pDiagnostic)) {
    return error;
  }

  bool has_mask_task_nv = false;
  bool has_mask_task_ext = false;
  std::vector<Instruction*> visited_entry_points;
  for (auto& instruction : vstate->ordered_instructions()) {
    {
      // In order to do this work outside of Process Instruction we need to be
      // able to, briefly, de-const the instruction.
      Instruction* inst = const_cast<Instruction*>(&instruction);

      if (inst->opcode() == spv::Op::OpEntryPoint) {
        const auto entry_point = inst->GetOperandAs<uint32_t>(1);
        const auto execution_model = inst->GetOperandAs<spv::ExecutionModel>(0);
        const std::string desc_name = inst->GetOperandAs<std::string>(2);

        ValidationState_t::EntryPointDescription desc;
        desc.name = desc_name;

        std::vector<uint32_t> interfaces;
        for (size_t j = 3; j < inst->operands().size(); ++j)
          desc.interfaces.push_back(inst->word(inst->operand(j).offset));

        vstate->RegisterEntryPoint(entry_point, execution_model,
                                   std::move(desc));

        if (visited_entry_points.size() > 0) {
          for (const Instruction* check_inst : visited_entry_points) {
            const auto check_execution_model =
                check_inst->GetOperandAs<spv::ExecutionModel>(0);
            const std::string check_name =
                check_inst->GetOperandAs<std::string>(2);

            if (desc_name == check_name &&
                execution_model == check_execution_model) {
              return vstate->diag(SPV_ERROR_INVALID_DATA, inst)
                     << "2 Entry points cannot share the same name and "
                        "ExecutionMode.";
            }
          }
        }
        visited_entry_points.push_back(inst);

        has_mask_task_nv |= (execution_model == spv::ExecutionModel::TaskNV ||
                             execution_model == spv::ExecutionModel::MeshNV);
        has_mask_task_ext |= (execution_model == spv::ExecutionModel::TaskEXT ||
                              execution_model == spv::ExecutionModel::MeshEXT);
      }
      if (inst->opcode() == spv::Op::OpFunctionCall) {
        if (!vstate->in_function_body()) {
          return vstate->diag(SPV_ERROR_INVALID_LAYOUT, &instruction)
                 << "A FunctionCall must happen within a function body.";
        }

        const auto called_id = inst->GetOperandAs<uint32_t>(2);
        vstate->AddFunctionCallTarget(called_id);
      }

      if (vstate->in_function_body()) {
        inst->set_function(&(vstate->current_function()));
        inst->set_block(vstate->current_function().current_block());

        if (vstate->in_block() && spvOpcodeIsBlockTerminator(inst->opcode())) {
          vstate->current_function().current_block()->set_terminator(inst);
        }
      }

      if (auto error = IdPass(*vstate, inst)) return error;
    }

    if (auto error = CapabilityPass(*vstate, &instruction)) return error;
    if (auto error = ModuleLayoutPass(*vstate, &instruction)) return error;
    if (auto error = CfgPass(*vstate, &instruction)) return error;
    if (auto error = InstructionPass(*vstate, &instruction)) return error;

    // Now that all of the checks are done, update the state.
    {
      Instruction* inst = const_cast<Instruction*>(&instruction);
      vstate->RegisterInstruction(inst);
      if (inst->opcode() == spv::Op::OpTypeForwardPointer) {
        vstate->RegisterForwardPointer(inst->GetOperandAs<uint32_t>(0));
      }
    }
  }

  if (!vstate->has_memory_model_specified())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing required OpMemoryModel instruction.";

  if (vstate->in_function_body())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing OpFunctionEnd at end of module.";

  if (vstate->HasCapability(spv::Capability::BindlessTextureNV) &&
      !vstate->has_samplerimage_variable_address_mode_specified())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing required OpSamplerImageAddressingModeNV instruction.";

  if (has_mask_task_ext && has_mask_task_nv)
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << vstate->VkErrorID(7102)
           << "Module can't mix MeshEXT/TaskEXT with MeshNV/TaskNV Execution "
              "Model.";

  // Catch undefined forward references before performing further checks.
  if (auto error = ValidateForwardDecls(*vstate)) return error;

  // Calculate reachability after all the blocks are parsed, but early that it
  // can be relied on in subsequent pases.
  ReachabilityPass(*vstate);

  // ID usage needs be handled in its own iteration of the instructions,
  // between the two others. It depends on the first loop to have been
  // finished, so that all instructions have been registered. And the following
  // loop depends on all of the usage data being populated. Thus it cannot live
  // in either of those iterations.
  // It should also live after the forward declaration check, since it will
  // have problems with missing forward declarations, but give less useful error
  // messages.
  for (size_t i = 0; i < vstate->ordered_instructions().size(); ++i) {
    auto& instruction = vstate->ordered_instructions()[i];
    if (auto error = UpdateIdUse(*vstate, &instruction)) return error;
  }

  // Validate individual opcodes.
  for (size_t i = 0; i < vstate->ordered_instructions().size(); ++i) {
    auto& instruction = vstate->ordered_instructions()[i];

    // Keep these passes in the order they appear in the SPIR-V specification
    // sections to maintain test consistency.
    if (auto error = MiscPass(*vstate, &instruction)) return error;
    if (auto error = DebugPass(*vstate, &instruction)) return error;
    if (auto error = AnnotationPass(*vstate, &instruction)) return error;
    if (auto error = ExtensionPass(*vstate, &instruction)) return error;
    if (auto error = ModeSettingPass(*vstate, &instruction)) return error;
    if (auto error = TypePass(*vstate, &instruction)) return error;
    if (auto error = ConstantPass(*vstate, &instruction)) return error;
    if (auto error = MemoryPass(*vstate, &instruction)) return error;
    if (auto error = FunctionPass(*vstate, &instruction)) return error;
    if (auto error = ImagePass(*vstate, &instruction)) return error;
    if (auto error = ConversionPass(*vstate, &instruction)) return error;
    if (auto error = CompositesPass(*vstate, &instruction)) return error;
    if (auto error = ArithmeticsPass(*vstate, &instruction)) return error;
    if (auto error = BitwisePass(*vstate, &instruction)) return error;
    if (auto error = LogicalsPass(*vstate, &instruction)) return error;
    if (auto error = ControlFlowPass(*vstate, &instruction)) return error;
    if (auto error = DerivativesPass(*vstate, &instruction)) return error;
    if (auto error = AtomicsPass(*vstate, &instruction)) return error;
    if (auto error = PrimitivesPass(*vstate, &instruction)) return error;
    if (auto error = BarriersPass(*vstate, &instruction)) return error;
    // Group
    // Device-Side Enqueue
    // Pipe
    if (auto error = NonUniformPass(*vstate, &instruction)) return error;

    if (auto error = LiteralsPass(*vstate, &instruction)) return error;
    if (auto error = RayQueryPass(*vstate, &instruction)) return error;
    if (auto error = RayTracingPass(*vstate, &instruction)) return error;
    if (auto error = RayReorderNVPass(*vstate, &instruction)) return error;
    if (auto error = MeshShadingPass(*vstate, &instruction)) return error;
    if (auto error = TensorLayoutPass(*vstate, &instruction)) return error;
  }

  // Validate the preconditions involving adjacent instructions. e.g.
  // spv::Op::OpPhi must only be preceded by spv::Op::OpLabel, spv::Op::OpPhi,
  // or spv::Op::OpLine.
  if (auto error = ValidateAdjacency(*vstate)) return error;

  if (auto error = ValidateEntryPoints(*vstate)) return error;
  // CFG checks are performed after the binary has been parsed
  // and the CFGPass has collected information about the control flow
  if (auto error = PerformCfgChecks(*vstate)) return error;
  if (auto error = CheckIdDefinitionDominateUse(*vstate)) return error;
  if (auto error = ValidateDecorations(*vstate)) return error;
  if (auto error = ValidateInterfaces(*vstate)) return error;
  // TODO(dsinclair): Restructure ValidateBuiltins so we can move into the
  // for() above as it loops over all ordered_instructions internally.
  if (auto error = ValidateBuiltIns(*vstate)) return error;
  // These checks must be performed after individual opcode checks because
  // those checks register the limitation checked here.
  for (const auto& inst : vstate->ordered_instructions()) {
    if (auto error = ValidateExecutionLimitations(*vstate, &inst)) return error;
    if (auto error = ValidateSmallTypeUses(*vstate, &inst)) return error;
    if (auto error = ValidateQCOMImageProcessingTextureUsages(*vstate, &inst))
      return error;
  }

  return SPV_SUCCESS;
}